

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall opengv::absolute_pose::modules::Epnp::solve_for_sign(Epnp *this)

{
  ulong *puVar1;
  ulong *puVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined4 in_ESI;
  uint uVar10;
  undefined4 in_register_00000034;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  pdVar3 = this->pcs;
  if (((pdVar3[2] < 0.0) && (0 < *this->signs)) || ((0.0 < pdVar3[2] && (*this->signs < 0)))) {
    uVar10 = CONCAT31((int3)((uint)in_ESI >> 8),7);
    lVar9 = 0;
    do {
      puVar1 = (ulong *)((long)this->ccs[0] + lVar9);
      uVar8 = puVar1[1];
      uVar7 = puVar1[2];
      puVar2 = (ulong *)((long)this->ccs[0] + lVar9);
      bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
      *puVar2 = *puVar1 ^ 0x8000000000000000;
      puVar2[1] = (ulong)bVar4 * (((byte)(uVar10 >> 1) & 1) * uVar8 ^ 0x8000000000000000) |
                  (ulong)!bVar4 * puVar2[1];
      puVar2[2] = (ulong)bVar5 * (((byte)(uVar10 >> 2) & 1) * uVar7 ^ 0x8000000000000000) |
                  (ulong)!bVar5 * puVar2[2];
      puVar2[3] = puVar2[3];
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x60);
    if (0 < this->number_of_correspondences) {
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar12 = vpbroadcastq_avx512f(ZEXT816(0x18));
      auVar13 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
      auVar14 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar15 = vpbroadcastq_avx512f();
      uVar8 = (ulong)(this->number_of_correspondences + 7U & 0xfffffff8);
      auVar16 = vpbroadcastq_avx512f();
      do {
        auVar17 = vpmullq_avx512dq(auVar11,auVar12);
        uVar7 = vpcmpuq_avx512f(auVar11,auVar16,2);
        auVar11 = vpaddq_avx512f(auVar11,auVar14);
        uVar8 = uVar8 - 8;
        auVar18 = vgatherqpd_avx512f(*(undefined8 *)
                                      ((long)pdVar3 + CONCAT44(in_register_00000034,uVar10)));
        bVar6 = (byte)uVar7;
        auVar19._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar18._8_8_;
        auVar19._0_8_ = (ulong)(bVar6 & 1) * auVar18._0_8_;
        auVar19._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar18._16_8_;
        auVar19._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar18._24_8_;
        auVar19._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar18._32_8_;
        auVar19._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar18._40_8_;
        auVar19._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar18._48_8_;
        auVar19._56_8_ = (uVar7 >> 7) * auVar18._56_8_;
        auVar18 = vpaddq_avx512f(auVar15,auVar17);
        auVar19 = vxorpd_avx512dq(auVar19,auVar13);
        vscatterqpd_avx512f(ZEXT864(pdVar3) + auVar17,uVar7,auVar19);
        auVar17 = vgatherqpd_avx512f(this->vc);
        auVar20._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar17._8_8_;
        auVar20._0_8_ = (ulong)(bVar6 & 1) * auVar17._0_8_;
        auVar20._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar17._16_8_;
        auVar20._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar17._24_8_;
        auVar20._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar17._32_8_;
        auVar20._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar17._40_8_;
        auVar20._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar17._48_8_;
        auVar20._56_8_ = (uVar7 >> 7) * auVar17._56_8_;
        auVar17 = vxorpd_avx512dq(auVar20,auVar13);
        vscatterqpd_avx512f(ZEXT864(8) + auVar18,uVar7,auVar17);
        auVar17 = vgatherqpd_avx512f(this->fu);
        auVar21._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar17._8_8_;
        auVar21._0_8_ = (ulong)(bVar6 & 1) * auVar17._0_8_;
        auVar21._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar17._16_8_;
        auVar21._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar17._24_8_;
        auVar21._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar17._32_8_;
        auVar21._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar17._40_8_;
        auVar21._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar17._48_8_;
        auVar21._56_8_ = (uVar7 >> 7) * auVar17._56_8_;
        auVar17 = vxorpd_avx512dq(auVar21,auVar13);
        vscatterqpd_avx512f(ZEXT864(0x10) + auVar18,uVar7,auVar17);
      } while (uVar8 != 0);
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::solve_for_sign(void)
{
  //change2: the following method is not independent of the optical system
  /*if (pcs[2] < 0.0) {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
  ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++) {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }*/

  //change to this (using original depths)
  if( (pcs[2] < 0.0 && signs[0] > 0) || (pcs[2] > 0.0 && signs[0] < 0) )
  {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
        ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++)
    {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }
}